

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sound-core.c
# Opt level: O0

void load_sound(sound_data *sound_data)

{
  _Bool _Var1;
  sound_file_type *psVar2;
  size_t sVar3;
  size_t sVar4;
  size_t len;
  char *pcVar5;
  byte local_839;
  sound_file_type *supported_sound_files;
  _Bool load_success;
  wchar_t i;
  size_t filename_buf_size;
  char *filename_buf;
  char path [2048];
  sound_data *sound_data_local;
  
  if ((hooks.load_sound_hook != (_func__Bool_char_ptr_int_sound_data_ptr *)0x0) &&
     (hooks.supported_files_hook != (_func_sound_file_type_ptr *)0x0)) {
    supported_sound_files._4_4_ = 0;
    supported_sound_files._3_1_ = false;
    psVar2 = (*hooks.supported_files_hook)();
    path_build((char *)&filename_buf,0x800,ANGBAND_DIR_SOUNDS,sound_data->name);
    while( true ) {
      local_839 = 0;
      if (psVar2[supported_sound_files._4_4_].type != 0) {
        local_839 = supported_sound_files._3_1_ ^ 0xff;
      }
      if ((local_839 & 1) == 0) break;
      sVar3 = strlen((char *)&filename_buf);
      sVar4 = strlen(psVar2[supported_sound_files._4_4_].extension);
      len = sVar3 + sVar4 + 1;
      pcVar5 = (char *)mem_zalloc(len);
      my_strcpy(pcVar5,(char *)&filename_buf,len);
      pcVar5 = string_append(pcVar5,psVar2[supported_sound_files._4_4_].extension);
      _Var1 = file_exists(pcVar5);
      if (_Var1) {
        sound_data->status = SOUND_ST_ERROR;
        supported_sound_files._3_1_ =
             (*hooks.load_sound_hook)(pcVar5,psVar2[supported_sound_files._4_4_].type,sound_data);
      }
      mem_free(pcVar5);
      supported_sound_files._4_4_ = supported_sound_files._4_4_ + 1;
    }
    if (supported_sound_files._3_1_ == false) {
      plog_fmt("Failed to load sound \'%s\'",sound_data->name);
    }
  }
  return;
}

Assistant:

static void load_sound(struct sound_data *sound_data)
{
	if ((hooks.load_sound_hook) && (hooks.supported_files_hook)) {
		char path[2048];
		char *filename_buf;
		size_t filename_buf_size;
		int i = 0;
		bool load_success = false;

		const struct sound_file_type *supported_sound_files = hooks.supported_files_hook();

		/* Build the path to the sound file (minus extension) */
		path_build(path, sizeof(path), ANGBAND_DIR_SOUNDS, sound_data->name);

		/*
		 * Loop through all the extensions supported by the
		 * platform's sound module.
		 */
		while ((0 != supported_sound_files[i].type) && (!load_success)) {
			/*
			 * Create a buffer to store the filename plus extension
			 */
			filename_buf_size = strlen(path) + strlen(supported_sound_files[i].extension) + 1;
			filename_buf = mem_zalloc(filename_buf_size);
			my_strcpy(filename_buf, path, filename_buf_size);
			filename_buf = string_append(filename_buf, supported_sound_files[i].extension);

			if (file_exists(filename_buf)) {
				sound_data->status = SOUND_ST_ERROR;
				load_success = hooks.load_sound_hook(
					filename_buf,
					supported_sound_files[i].type,
					sound_data);
			}

			mem_free(filename_buf);
			i++;
		}

		if (!load_success)
			plog_fmt("Failed to load sound '%s'", sound_data->name);
	}
}